

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O3

void __thiscall
BufferedFileTest_MoveFromTemporaryInCtor_Test::TestBody
          (BufferedFileTest_MoveFromTemporaryInCtor_Test *this)

{
  bool bVar1;
  char *message;
  buffered_file f;
  AssertionResult gtest_ar;
  FILE *fp;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  buffered_file local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  _IO_FILE *local_18;
  
  local_18 = (_IO_FILE *)0x0;
  open_buffered_file(&local_30.file_);
  local_40.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30.file_;
  testing::internal::CmpHelperEQ<_IO_FILE*,_IO_FILE*>
            (local_28,"fp","f.get()",&local_18,(_IO_FILE **)&local_40);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/posix-test.cc"
               ,0x5f,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  fmt::v5::buffered_file::~buffered_file(&local_30);
  return;
}

Assistant:

TEST(BufferedFileTest, MoveFromTemporaryInCtor) {
  FILE *fp = FMT_NULL;
  buffered_file f(open_buffered_file(&fp));
  EXPECT_EQ(fp, f.get());
}